

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::AddRectFilledMultiColor
          (ImDrawList *this,ImVec2 *p_min,ImVec2 *p_max,ImU32 col_upr_left,ImU32 col_upr_right,
          ImU32 col_bot_right,ImU32 col_bot_left)

{
  ImDrawIdx *pIVar1;
  ImVec2 local_40;
  ImVec2 uv;
  
  if (0xffffff < (col_upr_right | col_upr_left | col_bot_right | col_bot_left)) {
    uv = this->_Data->TexUvWhitePixel;
    PrimReserve(this,6,4);
    *this->_IdxWritePtr = (ImDrawIdx)this->_VtxCurrentIdx;
    pIVar1 = this->_IdxWritePtr;
    this->_IdxWritePtr = pIVar1 + 1;
    pIVar1[1] = (short)this->_VtxCurrentIdx + 1;
    pIVar1 = this->_IdxWritePtr;
    this->_IdxWritePtr = pIVar1 + 1;
    pIVar1[1] = (short)this->_VtxCurrentIdx + 2;
    pIVar1 = this->_IdxWritePtr;
    this->_IdxWritePtr = pIVar1 + 1;
    pIVar1[1] = (ImDrawIdx)this->_VtxCurrentIdx;
    pIVar1 = this->_IdxWritePtr;
    this->_IdxWritePtr = pIVar1 + 1;
    pIVar1[1] = (short)this->_VtxCurrentIdx + 2;
    pIVar1 = this->_IdxWritePtr;
    this->_IdxWritePtr = pIVar1 + 1;
    pIVar1[1] = (short)this->_VtxCurrentIdx + 3;
    this->_IdxWritePtr = this->_IdxWritePtr + 1;
    PrimWriteVtx(this,p_min,&uv,col_upr_left);
    local_40.x = p_max->x;
    local_40.y = p_min->y;
    PrimWriteVtx(this,&local_40,&uv,col_upr_right);
    PrimWriteVtx(this,p_max,&uv,col_bot_right);
    local_40.x = p_min->x;
    local_40.y = p_max->y;
    PrimWriteVtx(this,&local_40,&uv,col_bot_left);
  }
  return;
}

Assistant:

void ImDrawList::AddRectFilledMultiColor(const ImVec2& p_min, const ImVec2& p_max, ImU32 col_upr_left, ImU32 col_upr_right, ImU32 col_bot_right, ImU32 col_bot_left)
{
    if (((col_upr_left | col_upr_right | col_bot_right | col_bot_left) & IM_COL32_A_MASK) == 0)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;
    PrimReserve(6, 4);
    PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx)); PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx + 1)); PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx + 2));
    PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx)); PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx + 2)); PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx + 3));
    PrimWriteVtx(p_min, uv, col_upr_left);
    PrimWriteVtx(ImVec2(p_max.x, p_min.y), uv, col_upr_right);
    PrimWriteVtx(p_max, uv, col_bot_right);
    PrimWriteVtx(ImVec2(p_min.x, p_max.y), uv, col_bot_left);
}